

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ulong uVar46;
  byte bVar47;
  int iVar48;
  uint uVar49;
  long lVar50;
  ulong uVar51;
  long lVar52;
  ulong uVar53;
  ulong *puVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  bool bVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar67;
  uint uVar68;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar69;
  undefined1 auVar66 [16];
  vint4 bi;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  vint4 ai;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  NodeRef stack [244];
  ulong local_918;
  undefined1 local_8f8 [8];
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar54 = local_7d0;
  local_7d8 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar59._4_4_ = uVar2;
  auVar59._0_4_ = uVar2;
  auVar59._8_4_ = uVar2;
  auVar59._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar60._4_4_ = uVar2;
  auVar60._0_4_ = uVar2;
  auVar60._8_4_ = uVar2;
  auVar60._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar61._4_4_ = uVar2;
  auVar61._0_4_ = uVar2;
  auVar61._8_4_ = uVar2;
  auVar61._12_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar55 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar48 = (tray->tnear).field_0.i[k];
  auVar62._4_4_ = iVar48;
  auVar62._0_4_ = iVar48;
  auVar62._8_4_ = iVar48;
  auVar62._12_4_ = iVar48;
  iVar48 = (tray->tfar).field_0.i[k];
  auVar63._4_4_ = iVar48;
  auVar63._0_4_ = iVar48;
  auVar63._8_4_ = iVar48;
  auVar63._12_4_ = iVar48;
  bVar58 = true;
  do {
    uVar56 = puVar54[-1];
    puVar54 = puVar54 + -1;
    while ((uVar56 & 8) == 0) {
      auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + uVar46),auVar59);
      auVar64._0_4_ = auVar65._0_4_ * fVar3;
      auVar64._4_4_ = auVar65._4_4_ * fVar3;
      auVar64._8_4_ = auVar65._8_4_ * fVar3;
      auVar64._12_4_ = auVar65._12_4_ * fVar3;
      auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + uVar53),auVar60);
      auVar70._0_4_ = auVar65._0_4_ * fVar4;
      auVar70._4_4_ = auVar65._4_4_ * fVar4;
      auVar70._8_4_ = auVar65._8_4_ * fVar4;
      auVar70._12_4_ = auVar65._12_4_ * fVar4;
      auVar65 = vpmaxsd_avx(auVar64,auVar70);
      auVar64 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + uVar55),auVar61);
      auVar71._0_4_ = auVar64._0_4_ * fVar5;
      auVar71._4_4_ = auVar64._4_4_ * fVar5;
      auVar71._8_4_ = auVar64._8_4_ * fVar5;
      auVar71._12_4_ = auVar64._12_4_ * fVar5;
      auVar64 = vpmaxsd_avx(auVar71,auVar62);
      auVar65 = vpmaxsd_avx(auVar65,auVar64);
      auVar64 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + (uVar46 ^ 0x10)),auVar59);
      auVar72._0_4_ = auVar64._0_4_ * fVar3;
      auVar72._4_4_ = auVar64._4_4_ * fVar3;
      auVar72._8_4_ = auVar64._8_4_ * fVar3;
      auVar72._12_4_ = auVar64._12_4_ * fVar3;
      auVar64 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + (uVar53 ^ 0x10)),auVar60);
      auVar77._0_4_ = auVar64._0_4_ * fVar4;
      auVar77._4_4_ = auVar64._4_4_ * fVar4;
      auVar77._8_4_ = auVar64._8_4_ * fVar4;
      auVar77._12_4_ = auVar64._12_4_ * fVar4;
      auVar64 = vpminsd_avx(auVar72,auVar77);
      auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + (uVar55 ^ 0x10)),auVar61);
      auVar78._0_4_ = auVar70._0_4_ * fVar5;
      auVar78._4_4_ = auVar70._4_4_ * fVar5;
      auVar78._8_4_ = auVar70._8_4_ * fVar5;
      auVar78._12_4_ = auVar70._12_4_ * fVar5;
      auVar70 = vpminsd_avx(auVar78,auVar63);
      auVar64 = vpminsd_avx(auVar64,auVar70);
      auVar65 = vpcmpgtd_avx(auVar65,auVar64);
      iVar48 = vmovmskps_avx(auVar65);
      if (iVar48 == 0xf) goto LAB_0031311e;
      bVar47 = (byte)iVar48 ^ 0xf;
      uVar51 = uVar56 & 0xfffffffffffffff0;
      lVar50 = 0;
      if (bVar47 != 0) {
        for (; (bVar47 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
        }
      }
      uVar56 = *(ulong *)(uVar51 + lVar50 * 8);
      uVar49 = bVar47 - 1 & (uint)bVar47;
      if (uVar49 != 0) {
        *puVar54 = uVar56;
        puVar54 = puVar54 + 1;
        lVar50 = 0;
        if (uVar49 != 0) {
          for (; (uVar49 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
          }
        }
        uVar56 = *(ulong *)(uVar51 + lVar50 * 8);
        uVar49 = uVar49 - 1 & uVar49;
        uVar57 = (ulong)uVar49;
        if (uVar49 != 0) {
          do {
            *puVar54 = uVar56;
            puVar54 = puVar54 + 1;
            lVar50 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
              }
            }
            uVar56 = *(ulong *)(uVar51 + lVar50 * 8);
            uVar57 = uVar57 & uVar57 - 1;
          } while (uVar57 != 0);
        }
      }
    }
    uVar51 = (ulong)((uint)uVar56 & 0xf);
    if (uVar51 != 8) {
      uVar56 = uVar56 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4);
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x10);
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x20);
      fVar8 = *(float *)(ray + k * 4 + 0x40);
      fVar9 = *(float *)(ray + k * 4 + 0x50);
      fVar10 = *(float *)(ray + k * 4 + 0x60);
      lVar50 = 0;
      do {
        lVar52 = lVar50 * 0xb0;
        pfVar1 = (float *)(uVar56 + 0x80 + lVar52);
        fVar19 = *pfVar1;
        fVar20 = pfVar1[1];
        fVar21 = pfVar1[2];
        fVar22 = pfVar1[3];
        pfVar1 = (float *)(uVar56 + 0x40 + lVar52);
        fVar23 = *pfVar1;
        fVar24 = pfVar1[1];
        fVar25 = pfVar1[2];
        fVar26 = pfVar1[3];
        auVar79._0_4_ = fVar19 * fVar23;
        auVar79._4_4_ = fVar20 * fVar24;
        auVar79._8_4_ = fVar21 * fVar25;
        auVar79._12_4_ = fVar22 * fVar26;
        pfVar1 = (float *)(uVar56 + 0x70 + lVar52);
        fVar27 = *pfVar1;
        fVar28 = pfVar1[1];
        fVar29 = pfVar1[2];
        fVar30 = pfVar1[3];
        pfVar1 = (float *)(uVar56 + 0x50 + lVar52);
        fVar31 = *pfVar1;
        fVar32 = pfVar1[1];
        fVar33 = pfVar1[2];
        fVar34 = pfVar1[3];
        auVar80._0_4_ = fVar27 * fVar31;
        auVar80._4_4_ = fVar28 * fVar32;
        auVar80._8_4_ = fVar29 * fVar33;
        auVar80._12_4_ = fVar30 * fVar34;
        auVar65 = vsubps_avx(auVar80,auVar79);
        pfVar1 = (float *)(uVar56 + 0x60 + lVar52);
        fVar35 = *pfVar1;
        fVar36 = pfVar1[1];
        fVar37 = pfVar1[2];
        fVar38 = pfVar1[3];
        local_8f8._4_4_ = fVar32 * fVar36;
        local_8f8._0_4_ = fVar31 * fVar35;
        fStack_8f0 = fVar33 * fVar37;
        fStack_8ec = fVar34 * fVar38;
        auVar45._4_4_ = uVar2;
        auVar45._0_4_ = uVar2;
        auVar45._8_4_ = uVar2;
        auVar45._12_4_ = uVar2;
        auVar64 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + lVar52),auVar45);
        auVar44._4_4_ = uVar6;
        auVar44._0_4_ = uVar6;
        auVar44._8_4_ = uVar6;
        auVar44._12_4_ = uVar6;
        auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x10 + lVar52),auVar44);
        auVar43._4_4_ = uVar7;
        auVar43._0_4_ = uVar7;
        auVar43._8_4_ = uVar7;
        auVar43._12_4_ = uVar7;
        auVar71 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + lVar52),auVar43);
        pfVar1 = (float *)(uVar56 + 0x30 + lVar52);
        fVar39 = *pfVar1;
        fVar40 = pfVar1[1];
        fVar41 = pfVar1[2];
        fVar42 = pfVar1[3];
        auVar85._0_4_ = fVar19 * fVar39;
        auVar85._4_4_ = fVar20 * fVar40;
        auVar85._8_4_ = fVar21 * fVar41;
        auVar85._12_4_ = fVar22 * fVar42;
        auVar72 = vsubps_avx(auVar85,_local_8f8);
        auVar93._0_4_ = fVar27 * fVar39;
        auVar93._4_4_ = fVar28 * fVar40;
        auVar93._8_4_ = fVar29 * fVar41;
        auVar93._12_4_ = fVar30 * fVar42;
        auVar86._0_4_ = fVar35 * fVar23;
        auVar86._4_4_ = fVar36 * fVar24;
        auVar86._8_4_ = fVar37 * fVar25;
        auVar86._12_4_ = fVar38 * fVar26;
        auVar77 = vsubps_avx(auVar86,auVar93);
        fVar11 = auVar71._0_4_;
        auVar73._0_4_ = fVar9 * fVar11;
        fVar13 = auVar71._4_4_;
        auVar73._4_4_ = fVar9 * fVar13;
        fVar15 = auVar71._8_4_;
        auVar73._8_4_ = fVar9 * fVar15;
        fVar17 = auVar71._12_4_;
        auVar73._12_4_ = fVar9 * fVar17;
        fVar12 = auVar70._0_4_;
        auVar87._0_4_ = fVar10 * fVar12;
        fVar14 = auVar70._4_4_;
        auVar87._4_4_ = fVar10 * fVar14;
        fVar16 = auVar70._8_4_;
        auVar87._8_4_ = fVar10 * fVar16;
        fVar18 = auVar70._12_4_;
        auVar87._12_4_ = fVar10 * fVar18;
        auVar70 = vsubps_avx(auVar87,auVar73);
        fVar89 = auVar64._0_4_;
        auVar88._0_4_ = fVar89 * fVar10;
        fVar90 = auVar64._4_4_;
        auVar88._4_4_ = fVar90 * fVar10;
        fVar91 = auVar64._8_4_;
        auVar88._8_4_ = fVar91 * fVar10;
        fVar92 = auVar64._12_4_;
        auVar88._12_4_ = fVar92 * fVar10;
        auVar94._0_4_ = fVar8 * fVar11;
        auVar94._4_4_ = fVar8 * fVar13;
        auVar94._8_4_ = fVar8 * fVar15;
        auVar94._12_4_ = fVar8 * fVar17;
        auVar64 = vsubps_avx(auVar94,auVar88);
        auVar95._0_4_ = fVar8 * fVar12;
        auVar95._4_4_ = fVar8 * fVar14;
        auVar95._8_4_ = fVar8 * fVar16;
        auVar95._12_4_ = fVar8 * fVar18;
        auVar81._0_4_ = fVar9 * fVar89;
        auVar81._4_4_ = fVar9 * fVar90;
        auVar81._8_4_ = fVar9 * fVar91;
        auVar81._12_4_ = fVar9 * fVar92;
        auVar71 = vsubps_avx(auVar81,auVar95);
        local_8f8._0_4_ = auVar72._0_4_;
        local_8f8._4_4_ = auVar72._4_4_;
        fStack_8f0 = auVar72._8_4_;
        fStack_8ec = auVar72._12_4_;
        local_8e8 = auVar65._0_4_;
        fStack_8e4 = auVar65._4_4_;
        fStack_8e0 = auVar65._8_4_;
        fStack_8dc = auVar65._12_4_;
        auVar96._0_4_ = fVar8 * local_8e8 + fVar9 * (float)local_8f8._0_4_ + auVar77._0_4_ * fVar10;
        auVar96._4_4_ = fVar8 * fStack_8e4 + fVar9 * (float)local_8f8._4_4_ + auVar77._4_4_ * fVar10
        ;
        auVar96._8_4_ = fVar8 * fStack_8e0 + fVar9 * fStack_8f0 + auVar77._8_4_ * fVar10;
        auVar96._12_4_ = fVar8 * fStack_8dc + fVar9 * fStack_8ec + auVar77._12_4_ * fVar10;
        local_828 = auVar70._0_4_;
        fStack_824 = auVar70._4_4_;
        fStack_820 = auVar70._8_4_;
        fStack_81c = auVar70._12_4_;
        auVar65._8_4_ = 0x80000000;
        auVar65._0_8_ = 0x8000000080000000;
        auVar65._12_4_ = 0x80000000;
        auVar65 = vandps_avx(auVar96,auVar65);
        uVar49 = auVar65._0_4_;
        auVar74._0_4_ =
             (float)(uVar49 ^ (uint)(local_828 * fVar35 +
                                    auVar71._0_4_ * fVar19 + auVar64._0_4_ * fVar27));
        uVar67 = auVar65._4_4_;
        auVar74._4_4_ =
             (float)(uVar67 ^ (uint)(fStack_824 * fVar36 +
                                    auVar71._4_4_ * fVar20 + auVar64._4_4_ * fVar28));
        uVar68 = auVar65._8_4_;
        auVar74._8_4_ =
             (float)(uVar68 ^ (uint)(fStack_820 * fVar37 +
                                    auVar71._8_4_ * fVar21 + auVar64._8_4_ * fVar29));
        uVar69 = auVar65._12_4_;
        auVar74._12_4_ =
             (float)(uVar69 ^ (uint)(fStack_81c * fVar38 +
                                    auVar71._12_4_ * fVar22 + auVar64._12_4_ * fVar30));
        auVar82._0_4_ =
             (float)(uVar49 ^ (uint)(local_828 * fVar39 +
                                    auVar71._0_4_ * fVar31 + auVar64._0_4_ * fVar23));
        auVar82._4_4_ =
             (float)(uVar67 ^ (uint)(fStack_824 * fVar40 +
                                    auVar71._4_4_ * fVar32 + auVar64._4_4_ * fVar24));
        auVar82._8_4_ =
             (float)(uVar68 ^ (uint)(fStack_820 * fVar41 +
                                    auVar71._8_4_ * fVar33 + auVar64._8_4_ * fVar25));
        auVar82._12_4_ =
             (float)(uVar69 ^ (uint)(fStack_81c * fVar42 +
                                    auVar71._12_4_ * fVar34 + auVar64._12_4_ * fVar26));
        auVar70 = ZEXT816(0) << 0x40;
        auVar65 = vcmpps_avx(auVar74,auVar70,5);
        auVar64 = vcmpps_avx(auVar82,auVar70,5);
        auVar65 = vandps_avx(auVar65,auVar64);
        auVar64 = vcmpps_avx(auVar96,auVar70,4);
        auVar65 = vandps_avx(auVar65,auVar64);
        auVar83._0_4_ = auVar74._0_4_ + auVar82._0_4_;
        auVar83._4_4_ = auVar74._4_4_ + auVar82._4_4_;
        auVar83._8_4_ = auVar74._8_4_ + auVar82._8_4_;
        auVar83._12_4_ = auVar74._12_4_ + auVar82._12_4_;
        auVar75._8_4_ = 0x7fffffff;
        auVar75._0_8_ = 0x7fffffff7fffffff;
        auVar75._12_4_ = 0x7fffffff;
        auVar64 = vandps_avx(auVar96,auVar75);
        auVar70 = vcmpps_avx(auVar83,auVar64,2);
        auVar71 = auVar70 & auVar65;
        if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar71[0xf] < '\0') {
          auVar65 = vandps_avx(auVar65,auVar70);
          auVar66._0_4_ =
               uVar49 ^ (uint)(fVar89 * local_8e8 +
                              (float)local_8f8._0_4_ * fVar12 + auVar77._0_4_ * fVar11);
          auVar66._4_4_ =
               uVar67 ^ (uint)(fVar90 * fStack_8e4 +
                              (float)local_8f8._4_4_ * fVar14 + auVar77._4_4_ * fVar13);
          auVar66._8_4_ =
               uVar68 ^ (uint)(fVar91 * fStack_8e0 + fStack_8f0 * fVar16 + auVar77._8_4_ * fVar15);
          auVar66._12_4_ =
               uVar69 ^ (uint)(fVar92 * fStack_8dc + fStack_8ec * fVar18 + auVar77._12_4_ * fVar17);
          fVar11 = *(float *)(ray + k * 4 + 0x30);
          auVar84._0_4_ = auVar64._0_4_ * fVar11;
          auVar84._4_4_ = auVar64._4_4_ * fVar11;
          auVar84._8_4_ = auVar64._8_4_ * fVar11;
          auVar84._12_4_ = auVar64._12_4_ * fVar11;
          auVar70 = vcmpps_avx(auVar84,auVar66,1);
          fVar11 = *(float *)(ray + k * 4 + 0x80);
          auVar76._0_4_ = auVar64._0_4_ * fVar11;
          auVar76._4_4_ = auVar64._4_4_ * fVar11;
          auVar76._8_4_ = auVar64._8_4_ * fVar11;
          auVar76._12_4_ = auVar64._12_4_ * fVar11;
          auVar64 = vcmpps_avx(auVar66,auVar76,2);
          auVar64 = vandps_avx(auVar70,auVar64);
          auVar65 = vandps_avx(auVar64,auVar65);
          iVar48 = vmovmskps_avx(auVar65);
          if (iVar48 != 0) {
            local_918._0_1_ = (byte)iVar48;
            local_918 = (ulong)(byte)local_918;
            do {
              uVar57 = 0;
              if (local_918 != 0) {
                for (; (local_918 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                }
              }
              if ((((context->scene->geometries).items
                    [*(uint *)(lVar52 + uVar56 + 0x90 + uVar57 * 4)].ptr)->mask &
                  *(uint *)(ray + k * 4 + 0x90)) != 0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar58;
              }
              local_918 = local_918 ^ 1L << (uVar57 & 0x3f);
            } while (local_918 != 0);
          }
        }
        lVar50 = lVar50 + 1;
      } while (lVar50 != uVar51 - 8);
    }
LAB_0031311e:
    bVar58 = puVar54 != &local_7d8;
    if (!bVar58) {
      return bVar58;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }